

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O3

int greatest_name_match(char *name,char *filter,int res_if_none)

{
  char cVar1;
  char cVar2;
  int iVar3;
  size_t __n;
  size_t sVar4;
  
  if ((filter != (char *)0x0) && (__n = strlen(filter), __n != 0)) {
    if ((greatest_info.exact_name_match != '\0') && (sVar4 = strlen(name), sVar4 != __n)) {
      return 0;
    }
    cVar2 = *name;
    res_if_none = 0;
    if (cVar2 != '\0') {
      cVar1 = *filter;
      do {
        if ((cVar2 == cVar1) && (iVar3 = strncmp(name,filter,__n), iVar3 == 0)) {
          return 1;
        }
        cVar2 = name[1];
        name = name + 1;
      } while (cVar2 != '\0');
    }
  }
  return res_if_none;
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}